

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentAddDomain(FmsComponent comp,FmsDomain domain)

{
  ulong uVar1;
  FmsInt FVar2;
  FmsInt FVar3;
  long lVar4;
  FmsInt FVar5;
  long *__s;
  long in_RSI;
  long in_RDI;
  FmsInt num_entities;
  FmsInt t;
  FmsInt num_main_entities;
  _FmsPart_private *part;
  FmsInt nc;
  _FmsPart_private *parts;
  FmsInt dim;
  FmsInt comp_dim;
  FmsInt num_parts;
  ulong local_58;
  long local_50;
  void *local_38;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    local_4 = 2;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x20);
    FVar2 = *(FmsInt *)(in_RDI + 0x10);
    FVar3 = *(FmsInt *)(in_RSI + 0x130);
    if ((FVar2 == 0x7f) || (FVar2 == FVar3)) {
      local_38 = *(void **)(in_RDI + 0x30);
      FVar5 = NextPow2(uVar1 + 1);
      if (uVar1 <= FVar5 >> 1) {
        local_38 = realloc(local_38,FVar5 * 0xe8);
        if (local_38 == (void *)0x0) {
          return 4;
        }
        *(void **)(in_RDI + 0x30) = local_38;
      }
      __s = (long *)((long)local_38 + uVar1 * 0xe8);
      memset(__s,0,0xe8);
      *__s = in_RSI;
      local_50 = *(long *)(in_RDI + 0x18);
      for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
        lVar4 = *(long *)(in_RSI + local_58 * 8);
        __s[local_58 + 1] = lVar4;
        if (FmsEntityDim[local_58] == FVar3) {
          local_50 = lVar4 + local_50;
        }
      }
      if (FVar2 == 0x7f) {
        *(FmsInt *)(in_RDI + 0x10) = FVar3;
      }
      *(long *)(in_RDI + 0x18) = local_50;
      *(ulong *)(in_RDI + 0x20) = uVar1 + 1;
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

int FmsComponentAddDomain(FmsComponent comp, FmsDomain domain) {
  if (!comp) { E_RETURN(1); }
  if (!domain) { E_RETURN(2); }
  const FmsInt num_parts = comp->num_parts;
  const FmsInt comp_dim = comp->dim;
  const FmsInt dim = domain->dim;
  if (comp_dim != FMS_INVALID_DIM && comp_dim != dim) { E_RETURN(3); }
  struct _FmsPart_private *parts = comp->parts;
  // Reallocate comp->parts, if necessary
  FmsInt nc = NextPow2(num_parts + 1);
  if (num_parts <= nc/2) {
    parts = realloc(parts, nc*sizeof(*parts));
    if (parts == NULL) { E_RETURN(4); }
    comp->parts = parts;
  }
  struct _FmsPart_private *part = parts + num_parts;
  // Initialize part, counting the number of main entities
  memset(part, 0, sizeof(*part));
  part->domain = domain;
  FmsInt num_main_entities = comp->num_main_entities;
  for (FmsInt t = 0; t < FMS_NUM_ENTITY_TYPES; t++) {
    FmsInt num_entities = domain->num_entities[t];
    part->num_entities[t] = num_entities;
    if (FmsEntityDim[t] == dim) {
      num_main_entities += num_entities;
    }
    // the value of part->entities_ids_type[t] is not used
    // part->entities_ids[t] is already set to NULL
    // part->orientations[t] is already set to NULL
  }
  // Update comp
  if (comp_dim == FMS_INVALID_DIM) {
    comp->dim = dim;
  }
  comp->num_main_entities = num_main_entities;
  comp->num_parts = num_parts + 1;
  return 0;
}